

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noproxy.c
# Opt level: O0

_Bool Curl_check_noproxy(char *name,char *no_proxy,_Bool *spacesep)

{
  size_t __src;
  int iVar1;
  char *pcVar2;
  bool bVar3;
  _Bool local_191;
  char local_188 [8];
  char checkip [128];
  uint local_fc;
  uint bits;
  char *slash;
  char *check;
  ulong uStack_e0;
  _Bool match;
  size_t tokenlen;
  char *token;
  char *pcStack_c8;
  uint address;
  char *endptr;
  ulong uStack_b8;
  nametype type;
  size_t namelen;
  char *p;
  char hostip [128];
  _Bool *spacesep_local;
  char *no_proxy_local;
  char *name_local;
  
  *spacesep = false;
  if ((name == (char *)0x0) || (*name == '\0')) {
    return false;
  }
  if ((no_proxy != (char *)0x0) && (*no_proxy != '\0')) {
    endptr._4_4_ = 0;
    namelen = (size_t)no_proxy;
    hostip._120_8_ = spacesep;
    iVar1 = strcmp("*",no_proxy);
    if (iVar1 == 0) {
      return true;
    }
    if (*name == '[') {
      pcStack_c8 = strchr(name,0x5d);
      if (pcStack_c8 == (char *)0x0) {
        return false;
      }
      uStack_b8 = (long)pcStack_c8 - (long)(name + 1);
      if (0x7f < uStack_b8) {
        return false;
      }
      memcpy(&p,name + 1,uStack_b8);
      hostip[uStack_b8 - 8] = '\0';
      no_proxy_local = (char *)&p;
      endptr._4_4_ = 2;
    }
    else {
      uStack_b8 = strlen(name);
      iVar1 = inet_pton(2,name,(void *)((long)&token + 4));
      no_proxy_local = name;
      if (iVar1 == 1) {
        endptr._4_4_ = 1;
      }
      else if (name[uStack_b8 - 1] == '.') {
        uStack_b8 = uStack_b8 - 1;
      }
    }
    while (*(char *)namelen != '\0') {
      uStack_e0 = 0;
      check._7_1_ = false;
      while( true ) {
        __src = namelen;
        bVar3 = false;
        if ((*(char *)namelen != '\0') && (bVar3 = true, *(char *)namelen != ' ')) {
          bVar3 = *(char *)namelen == '\t';
        }
        if (!bVar3) break;
        namelen = namelen + 1;
      }
      tokenlen = namelen;
      while( true ) {
        bVar3 = false;
        if (((*(char *)namelen != '\0') && (bVar3 = false, *(char *)namelen != ' ')) &&
           (bVar3 = false, *(char *)namelen != '\t')) {
          bVar3 = *(char *)namelen != ',';
        }
        if (!bVar3) break;
        namelen = namelen + 1;
        uStack_e0 = uStack_e0 + 1;
      }
      if (uStack_e0 != 0) {
        if (endptr._4_4_ == 0) {
          if (*(char *)(__src + (uStack_e0 - 1)) == '.') {
            uStack_e0 = uStack_e0 - 1;
          }
          if ((uStack_e0 != 0) && (*(char *)__src == '.')) {
            tokenlen = __src + 1;
            uStack_e0 = uStack_e0 - 1;
          }
          if (uStack_e0 == uStack_b8) {
            iVar1 = curl_strnequal((char *)tokenlen,no_proxy_local,uStack_b8);
            check._7_1_ = iVar1 != 0;
          }
          else if (uStack_e0 < uStack_b8) {
            local_191 = false;
            if (no_proxy_local[(uStack_b8 - uStack_e0) + -1] == '.') {
              iVar1 = curl_strnequal((char *)tokenlen,no_proxy_local + (uStack_b8 - uStack_e0),
                                     uStack_e0);
              local_191 = iVar1 != 0;
            }
            check._7_1_ = local_191;
          }
        }
        else if ((endptr._4_4_ - 1U < 2) && (local_fc = 0, uStack_e0 < 0x80)) {
          memcpy(local_188,(void *)__src,uStack_e0);
          local_188[uStack_e0] = '\0';
          pcVar2 = strchr(local_188,0x2f);
          if (pcVar2 != (char *)0x0) {
            local_fc = atoi(pcVar2 + 1);
            *pcVar2 = '\0';
          }
          if (endptr._4_4_ == 2) {
            check._7_1_ = Curl_cidr6_match(no_proxy_local,local_188,local_fc);
          }
          else {
            check._7_1_ = Curl_cidr4_match(no_proxy_local,local_188,local_fc);
          }
        }
        if (check._7_1_ != false) {
          return true;
        }
      }
      while( true ) {
        bVar3 = true;
        if (*(char *)namelen != ' ') {
          bVar3 = *(char *)namelen == '\t';
        }
        if (!bVar3) break;
        namelen = namelen + 1;
      }
      if ((*(char *)namelen == '\0') || (*(char *)namelen == ',')) {
        for (; *(char *)namelen == ','; namelen = namelen + 1) {
        }
      }
      else {
        *(undefined1 *)hostip._120_8_ = 1;
      }
    }
  }
  return false;
}

Assistant:

bool Curl_check_noproxy(const char *name, const char *no_proxy,
                        bool *spacesep)
{
  char hostip[128];
  *spacesep = FALSE;
  /*
   * If we don't have a hostname at all, like for example with a FILE
   * transfer, we have nothing to interrogate the noproxy list with.
   */
  if(!name || name[0] == '\0')
    return FALSE;

  /* no_proxy=domain1.dom,host.domain2.dom
   *   (a comma-separated list of hosts which should
   *   not be proxied, or an asterisk to override
   *   all proxy variables)
   */
  if(no_proxy && no_proxy[0]) {
    const char *p = no_proxy;
    size_t namelen;
    enum nametype type = TYPE_HOST;
    if(!strcmp("*", no_proxy))
      return TRUE;

    /* NO_PROXY was specified and it wasn't just an asterisk */

    if(name[0] == '[') {
      char *endptr;
      /* IPv6 numerical address */
      endptr = strchr(name, ']');
      if(!endptr)
        return FALSE;
      name++;
      namelen = endptr - name;
      if(namelen >= sizeof(hostip))
        return FALSE;
      memcpy(hostip, name, namelen);
      hostip[namelen] = 0;
      name = hostip;
      type = TYPE_IPV6;
    }
    else {
      unsigned int address;
      namelen = strlen(name);
      if(1 == Curl_inet_pton(AF_INET, name, &address))
        type = TYPE_IPV4;
      else {
        /* ignore trailing dots in the host name */
        if(name[namelen - 1] == '.')
          namelen--;
      }
    }

    while(*p) {
      const char *token;
      size_t tokenlen = 0;
      bool match = FALSE;

      /* pass blanks */
      while(*p && ISBLANK(*p))
        p++;

      token = p;
      /* pass over the pattern */
      while(*p && !ISBLANK(*p) && (*p != ',')) {
        p++;
        tokenlen++;
      }

      if(tokenlen) {
        switch(type) {
        case TYPE_HOST:
          /* ignore trailing dots in the token to check */
          if(token[tokenlen - 1] == '.')
            tokenlen--;

          if(tokenlen && (*token == '.')) {
            /* ignore leading token dot as well */
            token++;
            tokenlen--;
          }
          /* A: example.com matches 'example.com'
             B: www.example.com matches 'example.com'
             C: nonexample.com DOES NOT match 'example.com'
          */
          if(tokenlen == namelen)
            /* case A, exact match */
            match = strncasecompare(token, name, namelen);
          else if(tokenlen < namelen) {
            /* case B, tailmatch domain */
            match = (name[namelen - tokenlen - 1] == '.') &&
              strncasecompare(token, name + (namelen - tokenlen),
                              tokenlen);
          }
          /* case C passes through, not a match */
          break;
        case TYPE_IPV4:
        case TYPE_IPV6: {
          const char *check = token;
          char *slash;
          unsigned int bits = 0;
          char checkip[128];
          if(tokenlen >= sizeof(checkip))
            /* this cannot match */
            break;
          /* copy the check name to a temp buffer */
          memcpy(checkip, check, tokenlen);
          checkip[tokenlen] = 0;
          check = checkip;

          slash = strchr(check, '/');
          /* if the slash is part of this token, use it */
          if(slash) {
            bits = atoi(slash + 1);
            *slash = 0; /* null terminate there */
          }
          if(type == TYPE_IPV6)
            match = Curl_cidr6_match(name, check, bits);
          else
            match = Curl_cidr4_match(name, check, bits);
          break;
        }
        }
        if(match)
          return TRUE;
      } /* if(tokenlen) */
      /* pass blanks after pattern */
      while(ISBLANK(*p))
        p++;
      /* if not a comma! */
      if(*p && (*p != ',')) {
        *spacesep = TRUE;
        continue;
      }
      /* pass any number of commas */
      while(*p == ',')
        p++;
    } /* while(*p) */
  } /* NO_PROXY was specified and it wasn't just an asterisk */

  return FALSE;
}